

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

line_status iniparser_line(char *input_line,char *section,char *key,char *value)

{
  uint len_00;
  int iVar1;
  char *s;
  size_t len;
  char *line;
  line_status sta;
  char *value_local;
  char *key_local;
  char *section_local;
  char *input_line_local;
  
  s = xstrdup(input_line);
  len_00 = strstrip(s);
  if ((ulong)len_00 == 0) {
    line._4_4_ = LINE_EMPTY;
  }
  else if ((*s == '#') || (*s == ';')) {
    line._4_4_ = LINE_COMMENT;
  }
  else if ((*s == '[') && (s[(ulong)len_00 - 1] == ']')) {
    __isoc99_sscanf(s,"[%[^]]",section);
    strstrip(section);
    strlwc(section,section,len_00);
    line._4_4_ = LINE_SECTION;
  }
  else {
    iVar1 = __isoc99_sscanf(s,"%[^=] = \"%[^\"]\"",key,value);
    if ((iVar1 == 2) || (iVar1 = __isoc99_sscanf(s,"%[^=] = \'%[^\']\'",key,value), iVar1 == 2)) {
      strstrip(key);
      strlwc(key,key,len_00);
      line._4_4_ = LINE_VALUE;
    }
    else {
      iVar1 = __isoc99_sscanf(s,"%[^=] = %[^;#]",key,value);
      if (iVar1 == 2) {
        strstrip(key);
        strlwc(key,key,len_00);
        strstrip(value);
        iVar1 = strcmp(value,"\"\"");
        if ((iVar1 == 0) || (iVar1 = strcmp(value,"\'\'"), iVar1 == 0)) {
          *value = '\0';
        }
        line._4_4_ = LINE_VALUE;
      }
      else {
        iVar1 = __isoc99_sscanf(s,"%[^=] = %[;#]",key,value);
        if ((iVar1 == 2) || (iVar1 = __isoc99_sscanf(s,"%[^=] %[=]",key,value), iVar1 == 2)) {
          strstrip(key);
          strlwc(key,key,len_00);
          *value = '\0';
          line._4_4_ = LINE_VALUE;
        }
        else {
          line._4_4_ = LINE_ERROR;
        }
      }
    }
  }
  free(s);
  return line._4_4_;
}

Assistant:

static line_status iniparser_line(
    const char * input_line,
    char * section,
    char * key,
    char * value)
{
    line_status sta ;
    char * line = NULL;
    size_t      len ;

    line = xstrdup(input_line);
    len = strstrip(line);

    sta = LINE_UNPROCESSED ;
    if (len < 1) {
        /* Empty line */
        sta = LINE_EMPTY ;
    } else if (line[0] == '#' || line[0] == ';') {
        /* Comment line */
        sta = LINE_COMMENT ;
    } else if (line[0] == '[' && line[len - 1] == ']') {
        /* Section name */
        sscanf(line, "[%[^]]", section);
        strstrip(section);
        strlwc(section, section, len);
        sta = LINE_SECTION ;
    } else if (sscanf (line, "%[^=] = \"%[^\"]\"", key, value) == 2
               ||  sscanf (line, "%[^=] = '%[^\']'",   key, value) == 2) {
        /* Usual key=value with quotes, with or without comments */
        strstrip(key);
        strlwc(key, key, len);
        /* Don't strip spaces from values surrounded with quotes */
        sta = LINE_VALUE ;
    } else if (sscanf (line, "%[^=] = %[^;#]", key, value) == 2) {
        /* Usual key=value without quotes, with or without comments */
        strstrip(key);
        strlwc(key, key, len);
        strstrip(value);
        /*
         * sscanf cannot handle '' or "" as empty values
         * this is done here
         */
        if (!strcmp(value, "\"\"") || (!strcmp(value, "''"))) {
            value[0] = 0 ;
        }
        sta = LINE_VALUE ;
    } else if (sscanf(line, "%[^=] = %[;#]", key, value) == 2
               ||  sscanf(line, "%[^=] %[=]", key, value) == 2) {
        /*
         * Special cases:
         * key=
         * key=;
         * key=#
         */
        strstrip(key);
        strlwc(key, key, len);
        value[0] = 0 ;
        sta = LINE_VALUE ;
    } else {
        /* Generate syntax error */
        sta = LINE_ERROR ;
    }

    free(line);
    return sta ;
}